

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O2

int make_pidfile(void)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t __n;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  char pid_str [20];
  
  if (cfg.pidfile == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = open(cfg.pidfile,0x241,0x1a4);
    pcVar1 = cfg.pidfile;
    if (iVar2 == -1) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      syslog(3,"can\'t open %s: %s\n",pcVar1,pcVar6);
    }
    else {
      uVar3 = getpid();
      snprintf(pid_str,0x14,"%u\n",(ulong)uVar3);
      __n = strlen(pid_str);
      sVar4 = write(iVar2,pid_str,__n);
      pcVar1 = cfg.pidfile;
      if (sVar4 == __n) {
        close(iVar2);
        return 0;
      }
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      syslog(3,"can\'t write to %s: %s\n",pcVar1,pcVar6);
      close(iVar2);
      unlink(cfg.pidfile);
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int make_pidfile() {
  size_t pid_strlen;
  char pid_str[20];
  int fd,rc=-1;
  pid_t pid;

  if (!cfg.pidfile) return 0;

  fd = open(cfg.pidfile, O_WRONLY|O_TRUNC|O_CREAT, 0644);
  if (fd == -1) {
   syslog(LOG_ERR,"can't open %s: %s\n",cfg.pidfile, strerror(errno));
   goto done;
  }

  pid = getpid();
  snprintf(pid_str,sizeof(pid_str),"%u\n",(unsigned)pid);
  pid_strlen = strlen(pid_str);
  if (write(fd,pid_str,pid_strlen) != pid_strlen) {
   syslog(LOG_ERR,"can't write to %s: %s\n",cfg.pidfile, strerror(errno));
   close(fd);
   unlink(cfg.pidfile);
   goto done;
  }

  close(fd);
  rc = 0;

 done:
  return rc;
}